

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

FIOBJ http_req2str(http_s *h)

{
  size_t sVar1;
  FIOBJ dest;
  FIOBJ FVar2;
  void *in_RCX;
  _func_int_FIOBJ_void_ptr *task;
  char *data;
  size_t sStack_60;
  header_writer_s w;
  fio_str_info_s t;
  
  if (h == (http_s *)0x0) {
    return 0;
  }
  if ((((h->method == 0) && (h->status_str == 0)) && (h->status != 0)) ||
     (sVar1 = fiobj_hash_count(h->headers), sVar1 == 0)) {
    return 0;
  }
  dest = fiobj_str_buf(0);
  w.dest = dest;
  if (h->status_str == 0) {
    fiobj_str_concat(dest,h->method);
    fiobj_str_write(dest," ",1);
    fiobj_str_concat(dest,h->path);
    if (h->query != 0) {
      fiobj_str_write(dest,"?",1);
      fiobj_str_concat(dest,h->query);
    }
    fiobj_obj2cstr(&t,h->version);
    if ((t.len < 6) || (t.data[5] != '1')) {
      data = " HTTP/1.1\r\n";
      sStack_60 = 10;
      goto LAB_001424b9;
    }
    fiobj_str_write(dest," ",1);
    FVar2 = h->version;
  }
  else {
    fiobj_str_concat(dest,h->version);
    fiobj_str_write(dest," ",1);
    FVar2 = fiobj_num_tmp(h->status);
    fiobj_str_concat(dest,FVar2);
    fiobj_str_write(dest," ",1);
    FVar2 = h->status_str;
  }
  fiobj_str_concat(dest,FVar2);
  data = "\r\n";
  sStack_60 = 2;
LAB_001424b9:
  fiobj_str_write(dest,data,sStack_60);
  fiobj_each1(h->headers,(size_t)&w,task,in_RCX);
  fiobj_str_write(w.dest,"\r\n",2);
  if (h->body != 0) {
    fiobj_str_concat(w.dest,h->body);
  }
  return w.dest;
}

Assistant:

FIOBJ http_req2str(http_s *h) {
  if (HTTP_INVALID_HANDLE(h) || !fiobj_hash_count(h->headers))
    return FIOBJ_INVALID;

  struct header_writer_s w;
  w.dest = fiobj_str_buf(0);
  if (h->status_str) {
    fiobj_str_join(w.dest, h->version);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, fiobj_num_tmp(h->status));
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->status_str);
    fiobj_str_write(w.dest, "\r\n", 2);
  } else {
    fiobj_str_join(w.dest, h->method);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    {
      fio_str_info_s t = fiobj_obj2cstr(h->version);
      if (t.len < 6 || t.data[5] != '1')
        fiobj_str_write(w.dest, " HTTP/1.1\r\n", 10);
      else {
        fiobj_str_write(w.dest, " ", 1);
        fiobj_str_join(w.dest, h->version);
        fiobj_str_write(w.dest, "\r\n", 2);
      }
    }
  }

  fiobj_each1(h->headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  if (h->body) {
    // fiobj_data_seek(h->body, 0);
    // fio_str_info_s t = fiobj_data_read(h->body, 0);
    // fiobj_str_write(w.dest, t.data, t.len);
    fiobj_str_join(w.dest, h->body);
  }
  return w.dest;
}